

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_inet_pton(int af,char *src,void *dst,size_t dstlen,int resolve_src)

{
  addrinfo *paVar1;
  int iVar2;
  int iVar3;
  addrinfo *res;
  addrinfo *local_70;
  addrinfo hints;
  
  hints.ai_socktype = 0;
  hints.ai_protocol = 0;
  hints.ai_addrlen = 0;
  hints._20_4_ = 0;
  hints.ai_addr = (sockaddr *)0x0;
  hints.ai_canonname = (char *)0x0;
  hints.ai_next = (addrinfo *)0x0;
  hints.ai_flags = 0;
  if (resolve_src == 0) {
    hints.ai_flags = 4;
  }
  hints.ai_family = af;
  iVar3 = 0;
  iVar2 = getaddrinfo(src,(char *)0x0,(addrinfo *)&hints,(addrinfo **)&res);
  if (iVar2 == 0) {
    iVar3 = 0;
    local_70 = res;
    while (paVar1 = res, res != (addrinfo *)0x0) {
      if ((res->ai_addrlen <= dstlen) && ((uint)res->ai_addr->sa_family == af)) {
        memcpy(dst,res->ai_addr,(ulong)res->ai_addrlen);
        iVar3 = 1;
      }
      res = paVar1->ai_next;
    }
    freeaddrinfo((addrinfo *)local_70);
  }
  return iVar3;
}

Assistant:

static int
mg_inet_pton(int af, const char *src, void *dst, size_t dstlen, int resolve_src)
{
	struct addrinfo hints, *res, *ressave;
	int func_ret = 0;
	int gai_ret;

	memset(&hints, 0, sizeof(struct addrinfo));
	hints.ai_family = af;
	if (!resolve_src) {
		hints.ai_flags = AI_NUMERICHOST;
	}

	gai_ret = getaddrinfo(src, NULL, &hints, &res);
	if (gai_ret != 0) {
		/* gai_strerror could be used to convert gai_ret to a string */
		/* POSIX return values: see
		 * http://pubs.opengroup.org/onlinepubs/9699919799/functions/freeaddrinfo.html
		 */
		/* Windows return values: see
		 * https://msdn.microsoft.com/en-us/library/windows/desktop/ms738520%28v=vs.85%29.aspx
		 */
		return 0;
	}

	ressave = res;

	while (res) {
		if ((dstlen >= (size_t)res->ai_addrlen)
		    && (res->ai_addr->sa_family == af)) {
			memcpy(dst, res->ai_addr, res->ai_addrlen);
			func_ret = 1;
		}
		res = res->ai_next;
	}

	freeaddrinfo(ressave);
	return func_ret;
}